

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_ugm_session::tokenize
          (llm_tokenizer_ugm_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  pointer pbVar1;
  float *pfVar2;
  char cVar3;
  undefined1 uVar4;
  llama_token id;
  int iVar5;
  undefined4 uVar6;
  pointer piVar7;
  iterator __position;
  bool bVar8;
  size_t sVar9;
  _Rb_tree_header *p_Var10;
  token_data *ptVar11;
  undefined4 *puVar12;
  long lVar13;
  _Base_ptr p_Var14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  _Base_ptr p_Var17;
  size_type sVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  _Base_ptr *pp_Var22;
  pointer pbVar23;
  float fVar24;
  string normalized;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  tokenization_results;
  allocator_type local_b9;
  size_t local_b8;
  string local_b0;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  local_90;
  pointer local_78;
  ulong local_70;
  pointer local_68;
  vector<int,std::allocator<int>> *local_60;
  long local_58;
  ulong local_50;
  value_type local_48;
  
  piVar7 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_78 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  normalize(this,text,&local_b0);
  sVar18 = local_b0._M_string_length;
  if (local_b0._M_string_length != 0) {
    local_48.token_id =
         *(llama_token *)
          ((long)(this->vocab->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                 .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
    local_48.input_offset = 0;
    local_48.score_sum = -3.4028235e+38;
    llama_vocab::std::
    vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
    ::vector(&local_90,local_b0._M_string_length + 1,&local_48,&local_b9);
    local_78 = (pointer)((long)local_78 - (long)piVar7);
    (local_90.
     super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
     ._M_impl.super__Vector_impl_data._M_start)->token_id =
         *(llama_token *)
          ((long)(this->vocab->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                 .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
    *(undefined8 *)
     &(local_90.
       super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = 0;
    *(undefined8 *)
     ((long)&(local_90.
              super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
              ._M_impl.super__Vector_impl_data._M_start)->input_offset + 4) = 0;
    *(undefined4 *)
     &(local_90.
       super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x14 = 0;
    uVar19 = 0;
    local_70 = sVar18;
    local_60 = (vector<int,std::allocator<int>> *)output;
    do {
      sVar9 = unicode_len_utf8(local_b0._M_dataplus._M_p[uVar19]);
      local_b8 = sVar18 - uVar19;
      if (sVar9 <= sVar18 - uVar19) {
        local_b8 = sVar9;
      }
      cVar3 = local_b0._M_dataplus._M_p[uVar19];
      p_Var10 = &(this->tokenizer->token_matcher).children._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = (this->tokenizer->token_matcher).children._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_parent;
      p_Var14 = &p_Var10->_M_header;
      for (; p_Var17 != (_Base_ptr)0x0; p_Var17 = (&p_Var17->_M_left)[(char)uVar4 < cVar3]) {
        uVar4 = (undefined1)p_Var17[1]._M_color;
        if (cVar3 <= (char)uVar4) {
          p_Var14 = p_Var17;
        }
      }
      p_Var17 = &p_Var10->_M_header;
      if (((_Rb_tree_header *)p_Var14 != p_Var10) &&
         (p_Var17 = p_Var14, cVar3 < (char)p_Var14[1]._M_color)) {
        p_Var17 = &p_Var10->_M_header;
      }
      lVar13 = uVar19 * 0x18;
      local_68 = local_90.
                 super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19;
      if (((_Rb_tree_header *)p_Var17 == p_Var10) || (uVar20 = uVar19 + 1, sVar18 < uVar20)) {
LAB_0021a5db:
        fVar24 = local_68->score_sum + this->tokenizer->unknown_token_score;
        pfVar2 = (float *)((long)&local_90.
                                  super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                                  ._M_impl.super__Vector_impl_data._M_start[local_b8].score_sum +
                          lVar13);
        if (*pfVar2 <= fVar24 && fVar24 != *pfVar2) {
          puVar16 = (undefined4 *)
                    ((long)&local_90.
                            super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_b8].token_id + lVar13);
          *puVar16 = *(undefined4 *)
                      ((long)(this->vocab->pimpl)._M_t.
                             super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                             .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
          *(ulong *)(puVar16 + 2) = uVar19;
          puVar16[4] = fVar24;
        }
      }
      else {
        bVar8 = false;
        bVar21 = false;
        local_58 = lVar13;
        local_50 = uVar19;
        do {
          if (*(char *)&p_Var17[2]._M_right == '\x01') {
            bVar21 = bVar8;
            if (uVar20 - uVar19 == local_b8) {
              bVar21 = true;
            }
            id = *(llama_token *)((long)&p_Var17[2]._M_right + 4);
            ptVar11 = llama_vocab::get_token_data(this->vocab,id);
            bVar8 = llama_vocab::impl::is_user_defined
                              ((impl *)(this->vocab->pimpl)._M_t.
                                       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                                       .super__Head_base<0UL,_llama_vocab::impl_*,_false>,id);
            fVar24 = 0.0;
            if (!bVar8) {
              fVar24 = ptVar11->score;
            }
            fVar24 = local_68->score_sum + fVar24;
            sVar18 = local_70;
            uVar19 = local_50;
            bVar8 = bVar21;
            if (local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20].score_sum < fVar24) {
              pbVar23 = local_90.
                        super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar20;
              pbVar23->token_id = id;
              pbVar23->input_offset = local_50;
              pbVar23->score_sum = fVar24;
            }
          }
          cVar3 = local_b0._M_dataplus._M_p[uVar20];
          pp_Var22 = &p_Var17[1]._M_left;
          p_Var14 = (_Base_ptr)pp_Var22;
          for (p_Var17 = p_Var17[1]._M_right; p_Var17 != (_Base_ptr)0x0;
              p_Var17 = (&p_Var17->_M_left)[(char)uVar4 < cVar3]) {
            uVar4 = (undefined1)p_Var17[1]._M_color;
            if (cVar3 <= (char)uVar4) {
              p_Var14 = p_Var17;
            }
          }
          p_Var17 = (_Base_ptr)pp_Var22;
          if ((p_Var14 != (_Base_ptr)pp_Var22) &&
             (p_Var17 = p_Var14, cVar3 < (char)p_Var14[1]._M_color)) {
            p_Var17 = (_Base_ptr)pp_Var22;
          }
        } while ((p_Var17 != (_Base_ptr)pp_Var22) && (uVar20 = uVar20 + 1, uVar20 <= sVar18));
        lVar13 = local_58;
        output = (vector<int,_std::allocator<int>_> *)local_60;
        if (!bVar21) goto LAB_0021a5db;
      }
      uVar19 = uVar19 + local_b8;
    } while (uVar19 < sVar18);
    pbVar23 = local_90.
              super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
              ._M_impl.super__Vector_impl_data._M_start + sVar18;
    bVar21 = false;
    while( true ) {
      iVar5 = pbVar23->token_id;
      bVar8 = iVar5 == *(int *)((long)(this->vocab->pimpl)._M_t.
                                      super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                                      .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
      if (!(bool)(bVar21 & bVar8)) {
        __position._M_current = *(int **)((long)output + 8);
        if (__position._M_current == *(int **)((long)output + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)output,__position,&pbVar23->token_id);
        }
        else {
          *__position._M_current = iVar5;
          *(int **)((long)output + 8) = __position._M_current + 1;
        }
      }
      sVar9 = pbVar23->input_offset;
      if (sVar9 == 0) break;
      uVar6 = *(undefined4 *)
               &local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar9].field_0x14;
      pbVar23->score_sum =
           local_90.
           super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar9].score_sum;
      *(undefined4 *)&pbVar23->field_0x14 = uVar6;
      pbVar1 = local_90.
               super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
               ._M_impl.super__Vector_impl_data._M_start + sVar9;
      uVar6 = *(undefined4 *)&pbVar1->field_0x4;
      sVar9 = pbVar1->input_offset;
      pbVar23->token_id = pbVar1->token_id;
      *(undefined4 *)&pbVar23->field_0x4 = uVar6;
      pbVar23->input_offset = sVar9;
      bVar21 = bVar8;
    }
    puVar16 = (undefined4 *)(*(long *)output + (long)local_78);
    puVar12 = *(undefined4 **)((long)output + 8) + -1;
    if (puVar16 < puVar12 && puVar16 != *(undefined4 **)((long)output + 8)) {
      puVar16 = (undefined4 *)(*(long *)output + (long)local_78);
      do {
        puVar15 = puVar16 + 1;
        uVar6 = *puVar16;
        *puVar16 = *puVar12;
        *puVar12 = uVar6;
        puVar12 = puVar12 + -1;
        puVar16 = puVar15;
      } while (puVar15 < puVar12);
    }
    if (local_90.
        super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        // get current size of output (for reversal later)
        size_t output_size = output.size();

        // normalize the input first
        std::string normalized;
        normalize(text, &normalized);
        size_t input_len = normalized.size();
        if (input_len == 0) {
            return;
        }

        // initialize score_sum to -FLT_MAX so it will be always lower than sums of token scores
        std::vector<struct best_tokenization> tokenization_results(input_len + 1, {vocab.token_unk(), 0, -FLT_MAX});
        // at the beginning tokenization score is zero
        tokenization_results[0] = { vocab.token_unk(), 0, 0 };

        for (size_t input_offset = 0; input_offset < input_len;) {
            size_t prefix_offset = input_offset;
            // calculate how many code units are in the currently processed UTF code point
            size_t n_utf8_code_units = std::min<size_t>(unicode_len_utf8(normalized[input_offset]), input_len - input_offset);

            // traverse the token matcher trie to find a matching token
            bool single_codepoint_token_found = false;
            const struct best_tokenization & current_best = tokenization_results[input_offset];
            const struct naive_trie * node = tokenizer.token_matcher.traverse(normalized[prefix_offset++]);

            while (prefix_offset <= input_len && node != NULL) {
                // check if we found valid token in prefix
                if (node->has_value) {
                    // check if it corresponds to the whole UTF code point
                    if (prefix_offset - input_offset == n_utf8_code_units) {
                        single_codepoint_token_found = true;
                    }
                    llama_token token_id = node->value;
                    const auto & token_data = vocab.get_token_data(token_id);

                    // we set the user-defined token scores to 0 to make them more likely to be selected
                    // (normal token scores are log probabilities, so they are negative)
                    // score type is double here to make tokenization results exactly
                    // the same as in the HF tokenizer using SentencePiece
                    const double token_score = vocab.is_user_defined(token_id) ? 0.0 : token_data.score;
                    const double challenger_score = current_best.score_sum + token_score;
                    struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                    if (challenger_score > current_champ.score_sum) {
                        struct best_tokenization challenger = { token_id, input_offset, (float) challenger_score };
                        current_champ = challenger;
                    }
                }
                node = node->traverse(normalized[prefix_offset++]);
            }

            // if we didn't find a valid token corresponding to the whole UTF code point
            // then use unknown token as the tokenization of this UTF code point
            if (!single_codepoint_token_found) {
                const double challenger_score = current_best.score_sum + tokenizer.unknown_token_score;
                prefix_offset = input_offset + n_utf8_code_units;
                struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                if (challenger_score > current_champ.score_sum) {
                    struct best_tokenization challenger = { vocab.token_unk(), input_offset, (float) challenger_score };
                    current_champ = challenger;
                }
            }

            // move to the next UTF code point
            input_offset += n_utf8_code_units;
        }

        // now backtrack from the end to gather token ids of the best tokenization
        // merge sequences of consecutive unknown tokens into single unknown tokens
        bool is_prev_unknown = false;
        for (struct best_tokenization & tokenization = tokenization_results[input_len]; ; tokenization = tokenization_results[tokenization.input_offset]) {
            bool is_unknown = tokenization.token_id == vocab.token_unk();
            if (!(is_prev_unknown && is_unknown)) {
                output.push_back(tokenization.token_id);
            }
            if (tokenization.input_offset == 0) {
                break;
            }
            is_prev_unknown = is_unknown;
        }

        // reverse the output since we added tokens starting from the end of the input
        std::reverse(output.begin() + output_size, output.end());
    }